

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O0

Length __thiscall tcmalloc::PageHeap::RoundUpSize(PageHeap *this,Length n)

{
  unsigned_long uVar1;
  Length rounded_n;
  Length n_local;
  PageHeap *this_local;
  
  this_local = (PageHeap *)
               ((n + this->smallest_span_size_) - 1 &
               (this->smallest_span_size_ - 1 ^ 0xffffffffffffffff));
  if (this_local < n) {
    uVar1 = std::numeric_limits<unsigned_long>::max();
    this_local = (PageHeap *)(uVar1 & (this->smallest_span_size_ - 1 ^ 0xffffffffffffffff));
  }
  return (Length)this_local;
}

Assistant:

Length PageHeap::RoundUpSize(Length n) {
  Length rounded_n = (n + smallest_span_size_ - 1) & ~(smallest_span_size_ - 1);
  if (rounded_n < n) {
    // Overflow happened. So make sure we oom by asking for biggest
    // amount possible.
    return std::numeric_limits<Length>::max() & ~(smallest_span_size_ - 1);
  }

  return rounded_n;
}